

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O2

vec3 __thiscall ltc::sample(ltc *this,vec3 *view_dir,vec2 *random_parameters)

{
  float fVar1;
  float __x;
  float fVar2;
  float fVar3;
  float fVar4;
  col_type cVar5;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 aVar6;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_58;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_48;
  mat3 local_3c;
  
  fVar1 = (random_parameters->field_0).field_0.x;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  __x = acosf(fVar1);
  fVar1 = (random_parameters->field_0).field_0.y * 6.2831855;
  fVar2 = sinf(__x);
  fVar3 = cosf(fVar1);
  fVar4 = sinf(__x);
  fVar1 = sinf(fVar1);
  local_48.field_0.z = cosf(__x);
  local_48._0_8_ = CONCAT44(fVar1 * fVar4,fVar3 * fVar2);
  get_framed_ltc_matrix(&local_3c,this);
  cVar5 = glm::operator*(&local_3c,(row_type *)&local_48.field_0);
  local_58.field_0.z = (float)cVar5.field_0._8_4_;
  local_58._0_8_ = cVar5.field_0._0_8_;
  aVar6.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                   ((vec<3,_float,_(glm::precision)0> *)&local_58.field_0);
  return (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)
         (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)aVar6.field_0;
}

Assistant:

glm::vec3 ltc::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  const float phi = std::acos(std::sqrt(random_parameters.x));
  const float theta = 2.0f * pi * random_parameters.y;

  const glm::vec3 original_sample{
    std::sin(phi) * std::cos(theta),
    std::sin(phi) * std::sin(theta),
    std::cos(phi)
  };

  return glm::normalize(get_framed_ltc_matrix() * original_sample);
}